

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::applyTransform(RenderTarget *this,Transform *transform)

{
  bool bVar1;
  float *pfVar2;
  Transform *in_RSI;
  Transform *in_RDI;
  Transform *unaff_retaddr;
  char *in_stack_00000130;
  uint in_stack_0000013c;
  char *in_stack_00000140;
  
  bVar1 = sf::operator==(unaff_retaddr,in_RDI);
  if (bVar1) {
    glLoadIdentity();
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  }
  else {
    pfVar2 = Transform::getMatrix(in_RSI);
    glLoadMatrixf(pfVar2);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  }
  return;
}

Assistant:

void RenderTarget::applyTransform(const Transform& transform)
{
    // No need to call glMatrixMode(GL_MODELVIEW), it is always the
    // current mode (for optimization purpose, since it's the most used)
    if (transform == Transform::Identity)
        glCheck(glLoadIdentity());
    else
        glCheck(glLoadMatrixf(transform.getMatrix()));
}